

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O1

int compress_bidder_init(archive_read_filter *self)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  long lVar3;
  
  self->code = 3;
  self->name = "compress (.Z)";
  __ptr = calloc(0x3ff80,1);
  __ptr_00 = malloc(0x10000);
  if (__ptr == (void *)0x0 || __ptr_00 == (void *)0x0) {
    free(__ptr_00);
    free(__ptr);
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for %s decompression",
                      "compress (.Z)");
    iVar2 = -0x1e;
  }
  else {
    self->data = __ptr;
    *(undefined8 *)((long)__ptr + 0x28) = 0x10000;
    *(void **)((long)__ptr + 0x30) = __ptr_00;
    self->read = compress_filter_read;
    self->skip = (_func_int64_t_archive_read_filter_ptr_int64_t *)0x0;
    self->close = compress_filter_close;
    getbits(self,8);
    getbits(self,8);
    uVar1 = getbits(self,8);
    *(uint *)((long)__ptr + 0x44) = uVar1 & 0x1f;
    *(int *)((long)__ptr + 0x40) = 1 << (sbyte)(uVar1 & 0x1f);
    *(uint *)((long)__ptr + 0x38) = uVar1 & 0x80;
    *(undefined4 *)((long)__ptr + 0x58) = 0x100;
    *(long *)((long)__ptr + 0x30060) = (long)__ptr + 0x30068;
    if ((uVar1 & 0x80) != 0) {
      *(undefined4 *)((long)__ptr + 0x58) = 0x101;
    }
    *(undefined8 *)((long)__ptr + 0x48) = 0x9000001ff;
    *(undefined4 *)((long)__ptr + 0x50) = 0xffffffff;
    lVar3 = 0;
    do {
      *(undefined2 *)((long)__ptr + lVar3 * 2 + 0x1025a) = 0;
      *(char *)((long)__ptr + lVar3 + 0x15b) = (char)lVar3 + -1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != -0x100);
    next_code(self);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
compress_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	int code;

	self->code = ARCHIVE_FILTER_COMPRESS;
	self->name = "compress (.Z)";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		free(out_block);
		free(state);
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for %s decompression",
		    self->name);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->read = compress_filter_read;
	self->skip = NULL; /* not supported */
	self->close = compress_filter_close;

	/* XXX MOVE THE FOLLOWING OUT OF INIT() XXX */

	(void)getbits(self, 8); /* Skip first signature byte. */
	(void)getbits(self, 8); /* Skip second signature byte. */

	code = getbits(self, 8);
	state->maxcode_bits = code & 0x1f;
	state->maxcode = (1 << state->maxcode_bits);
	state->use_reset_code = code & 0x80;

	/* Initialize decompressor. */
	state->free_ent = 256;
	state->stackp = state->stack;
	if (state->use_reset_code)
		state->free_ent++;
	state->bits = 9;
	state->section_end_code = (1<<state->bits) - 1;
	state->oldcode = -1;
	for (code = 255; code >= 0; code--) {
		state->prefix[code] = 0;
		state->suffix[code] = code;
	}
	next_code(self);

	return (ARCHIVE_OK);
}